

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O3

qint64 __thiscall QNetworkReplyHttpImpl::bytesAvailable(QNetworkReplyHttpImpl *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  qint64 qVar4;
  QDecompressHelper *this_00;
  
  lVar3 = *(long *)(this + 8);
  if (*(long *)(lVar3 + 0x2b8) != 0) {
    lVar2 = QIODevice::bytesAvailable();
    lVar3 = (**(code **)(**(long **)(lVar3 + 0x2b8) + 0xa0))();
LAB_00213968:
    return lVar3 + lVar2;
  }
  if (*(long *)(lVar3 + 0x330) != 0) {
    lVar2 = QIODevice::bytesAvailable();
    return (lVar2 + *(long *)(lVar3 + 0x318)) - *(long *)(lVar3 + 0x310);
  }
  this_00 = (QDecompressHelper *)(lVar3 + 0x388);
  bVar1 = QDecompressHelper::isValid(this_00);
  if (bVar1) {
    bVar1 = QDecompressHelper::isCountingBytes(this_00);
    if (bVar1) {
      lVar2 = QIODevice::bytesAvailable();
      lVar3 = QDecompressHelper::uncompressedSize(this_00);
      goto LAB_00213968;
    }
    bVar1 = QDecompressHelper::hasData(this_00);
    if (bVar1) {
      lVar3 = QIODevice::bytesAvailable();
      return lVar3 + 1;
    }
  }
  qVar4 = QIODevice::bytesAvailable();
  return qVar4;
}

Assistant:

qint64 QNetworkReplyHttpImpl::bytesAvailable() const
{
    Q_D(const QNetworkReplyHttpImpl);

    // if we load from cache device
    if (d->cacheLoadDevice) {
        return QNetworkReply::bytesAvailable() + d->cacheLoadDevice->bytesAvailable();
    }

    // zerocopy buffer
    if (d->downloadZerocopyBuffer) {
        return QNetworkReply::bytesAvailable() + d->downloadBufferCurrentSize - d->downloadBufferReadPosition;
    }

    if (d->decompressHelper.isValid()) {
        if (d->decompressHelper.isCountingBytes())
            return QNetworkReply::bytesAvailable() + d->decompressHelper.uncompressedSize();
        if (d->decompressHelper.hasData())
            return QNetworkReply::bytesAvailable() + 1;
    }

    // normal buffer
    return QNetworkReply::bytesAvailable();
}